

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_set_chunk_count(exr_context_t ctxt,int part_index,int32_t val)

{
  long lVar1;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_t *peVar3;
  undefined8 uVar4;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (*ctxt == (_priv_exr_context_t)0x3) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uVar4 = 0x15;
    }
    else {
      if (*ctxt != (_priv_exr_context_t)0x0) {
        lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
        peVar3 = *(exr_attribute_t **)(lVar1 + 0x80);
        if (peVar3 == (exr_attribute_t *)0x0) {
          eVar2 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"chunkCount",
                                    EXR_ATTR_INT,0,(uint8_t **)0x0,
                                    (exr_attribute_t **)(lVar1 + 0x80));
          if (eVar2 != 0) {
            return eVar2;
          }
          peVar3 = *(exr_attribute_t **)(lVar1 + 0x80);
        }
        else if (peVar3->type != EXR_ATTR_INT) {
          eVar2 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             peVar3->type_name,"chunkCount",*(code **)(ctxt + 0x48));
          return eVar2;
        }
        (peVar3->field_6).i = val;
        *(int32_t *)(lVar1 + 0xf4) = val;
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uVar4 = 8;
    }
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar4);
    return eVar2;
  }
  eVar2 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar2;
}

Assistant:

exr_result_t
exr_set_chunk_count (exr_context_t ctxt, int part_index, int32_t val)
{
    REQ_ATTR_FIND_CREATE (chunkCount, EXR_ATTR_INT);
    if (rv == EXR_ERR_SUCCESS)
    {
        attr->i           = val;
        part->chunk_count = val;
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}